

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O2

void __thiscall
tst_SerialiserCommon::insertBranch
          (tst_SerialiserCommon *this,QAbstractItemModel *model,QModelIndex *parent,bool multiRoles,
          int subBranches)

{
  default_random_engine *__urng;
  bool bVar1;
  result_type_conflict rVar2;
  int iVar3;
  int iVar4;
  int local_160;
  uniform_int_distribution<int> colorDistribution;
  QModelIndex idx;
  QArrayDataPointer<char16_t> local_118;
  QVariant local_f8;
  QString baseString;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  uniform_int_distribution<int> rowsDist;
  uniform_int_distribution<int> coulmnsDist;
  
  colorDistribution._M_param._M_a = 0;
  colorDistribution._M_param._M_b = 5;
  coulmnsDist._M_param._M_a = 2;
  coulmnsDist._M_param._M_b = 5;
  rowsDist._M_param._M_a = 3;
  rowsDist._M_param._M_b = 6;
  __urng = &this->generator;
  rVar2 = std::uniform_int_distribution<int>::operator()(&coulmnsDist,__urng);
  (**(code **)(*(long *)model + 0x100))(model,0,rVar2,parent);
  rVar2 = std::uniform_int_distribution<int>::operator()(&rowsDist,__urng);
  (**(code **)(*(long *)model + 0xf8))(model,0,rVar2,parent);
  bVar1 = QModelIndex::isValid(parent);
  if (bVar1) {
    QModelIndex::data(&local_f8,parent,2);
    QVariant::toString();
    local_a0.d = (Data *)0x0;
    local_a0.ptr = L"->";
    local_a0.size = 2;
    local_118.d = (Data *)0x0;
    local_118.ptr = (char16_t *)0x0;
    local_118.size = 0;
    operator+(&baseString,(QString *)&idx,(QString *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&idx);
    QVariant::~QVariant(&local_f8);
  }
  else {
    baseString.d.d = (Data *)0x0;
    baseString.d.ptr = (char16_t *)0x0;
    baseString.d.size = 0;
  }
  local_160 = 0;
  while( true ) {
    iVar3 = (**(code **)(*(long *)model + 0x78))(model,parent);
    if (iVar3 <= local_160) break;
    iVar3 = 0;
    while( true ) {
      iVar4 = (**(code **)(*(long *)model + 0x80))(model,parent);
      if (iVar4 <= iVar3) break;
      (**(code **)(*(long *)model + 0x60))(&idx,model,local_160,iVar3,parent);
      local_b8.d = (Data *)0x0;
      local_b8.ptr = L"%1,%2[%3]";
      local_b8.size = 9;
      local_88.d = (Data *)0x0;
      local_88.ptr = (char16_t *)0x0;
      local_88.size = 0;
      QString::arg((QString *)&local_58,(QString *)&local_b8,local_160,0,10,(QChar)0x20);
      QString::arg((QString *)&local_70,(QString *)&local_58,iVar3,0,10,(QChar)0x20);
      rVar2 = std::uniform_int_distribution<int>::operator()(&colorDistribution,__urng);
      QString::arg((QString *)&local_118,(QString *)&local_70,rVar2,0,10,(QChar)0x20);
      operator+((QString *)&local_a0,&baseString,(QString *)&local_118);
      QVariant::QVariant(&local_f8,(QString *)&local_a0);
      (**(code **)(*(long *)model + 0x98))(model,&idx,&local_f8,2);
      QVariant::~QVariant(&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      if (multiRoles) {
        rVar2 = std::uniform_int_distribution<int>::operator()(&colorDistribution,__urng);
        QVariant::QVariant(&local_f8,*(int *)(&DAT_0010bd30 + (long)rVar2 * 4));
        (**(code **)(*(long *)model + 0x98))(model,&idx,&local_f8,8);
        QVariant::~QVariant(&local_f8);
        rVar2 = std::uniform_int_distribution<int>::operator()(&colorDistribution,__urng);
        QVariant::QVariant(&local_f8,*(int *)(&DAT_0010bd30 + (long)rVar2 * 4));
        (**(code **)(*(long *)model + 0x98))(model,&idx,&local_f8,9);
        QVariant::~QVariant(&local_f8);
        QVariant::QVariant(&local_f8,local_160);
        (**(code **)(*(long *)model + 0x98))(model,&idx,&local_f8,0x100);
        QVariant::~QVariant(&local_f8);
        QVariant::QVariant(&local_f8,iVar3);
        (**(code **)(*(long *)model + 0x98))(model,&idx,&local_f8,0x101);
        QVariant::~QVariant(&local_f8);
      }
      if (0 < subBranches) {
        insertBranch(this,model,&idx,multiRoles,subBranches + -1);
      }
      iVar3 = iVar3 + 1;
    }
    local_160 = local_160 + 1;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&baseString.d);
  return;
}

Assistant:

void tst_SerialiserCommon::insertBranch(QAbstractItemModel *model, const QModelIndex &parent, bool multiRoles, int subBranches)
{
    Q_ASSERT(model);
    Q_ASSERT(!parent.isValid() || parent.model() == model);
    const int randomBrushes[] = {Qt::red, Qt::blue, Qt::green, Qt::yellow, Qt::magenta, Qt::cyan};
    std::uniform_int_distribution<int> colorDistribution(0, (sizeof(randomBrushes) / sizeof(randomBrushes[0])) - 1);
    std::uniform_int_distribution<int> coulmnsDist(2, 5);
    std::uniform_int_distribution<int> rowsDist(3, 6);
    Q_ASSUME(model->insertColumns(0, coulmnsDist(generator), parent));
    Q_ASSUME(model->insertRows(0, rowsDist(generator), parent));
    const QString baseString = parent.isValid() ? (parent.data(Qt::EditRole).toString() + QStringLiteral("->")) : QString();
    for (int i = 0; i < model->rowCount(parent); ++i) {
        for (int j = 0; j < model->columnCount(parent); ++j) {
            const QModelIndex idx = model->index(i, j, parent);
            model->setData(idx, baseString + QStringLiteral("%1,%2[%3]").arg(i).arg(j).arg(colorDistribution(generator)), Qt::EditRole);
            if (multiRoles) {
                model->setData(idx, randomBrushes[colorDistribution(generator)], Qt::BackgroundRole);
                model->setData(idx, randomBrushes[colorDistribution(generator)], Qt::ForegroundRole);
                model->setData(idx, i, Qt::UserRole);
                model->setData(idx, j, Qt::UserRole + 1);
            }
            if (subBranches > 0)
                insertBranch(model, idx, multiRoles, subBranches - 1);
        }
    }
}